

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdToTruth_rec(char *pStr,char **p,int *pMatches,word **pTtElems,word *pRes,int nVars)

{
  char cVar1;
  char cVar2;
  uint nWordsR;
  int nVars_00;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  word *pwVar10;
  word pFunc [64];
  word pTtTemp [64];
  word local_1a38 [64];
  word local_1838 [64];
  ulong auStack_1638 [64];
  ulong auStack_1438 [641];
  
  nWordsR = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWordsR = 1;
  }
  uVar7 = (ulong)nWordsR;
  pcVar8 = *p;
  cVar1 = *pcVar8;
  cVar2 = cVar1;
  if (cVar1 == '!') {
    *p = pcVar8 + 1;
    pcVar3 = pcVar8 + 1;
    pcVar8 = pcVar8 + 1;
    cVar2 = *pcVar3;
  }
  bVar4 = cVar2 + 0x9f;
  if (bVar4 < 0x1a) {
    if (nVars <= (int)(uint)bVar4) {
      __assert_fail("**p - \'a\' >= 0 && **p - \'a\' < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x21f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pwVar10 = pTtElems[(uint)bVar4];
    if (cVar1 == '!') {
      if (0 < (int)nWordsR) {
        uVar6 = 0;
        do {
          pRes[uVar6] = ~pwVar10[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
    else if (0 < (int)nWordsR) {
      uVar6 = 0;
      do {
        pRes[uVar6] = pwVar10[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
  }
  else if (cVar2 == '[') {
    if (pStr[pMatches[(long)pcVar8 - (long)pStr]] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x236,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar3 = pStr + pMatches[(long)pcVar8 - (long)pStr];
    if (0 < (int)nWordsR) {
      memset(pRes,0,uVar7 << 3);
    }
    pcVar8 = pcVar8 + 1;
    *p = pcVar8;
    if (pcVar8 < pcVar3) {
      do {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,local_1838,nVars);
        if (0 < (int)nWordsR) {
          uVar7 = 0;
          do {
            pRes[uVar7] = pRes[uVar7] ^ local_1838[uVar7];
            uVar7 = uVar7 + 1;
          } while (nWordsR != uVar7);
        }
        pcVar8 = *p + 1;
        *p = pcVar8;
      } while (pcVar8 < pcVar3);
    }
    if (pcVar8 != pcVar3) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x23d,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (cVar1 == '!' && 0 < (int)nWordsR) {
      uVar7 = 0;
      do {
        pRes[uVar7] = ~pRes[uVar7];
        uVar7 = uVar7 + 1;
      } while (nWordsR != uVar7);
    }
  }
  else {
    if (cVar2 == '<') {
      if (pStr[pMatches[(long)pcVar8 - (long)pStr]] != '>') {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x246,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      pcVar3 = pStr + pMatches[(long)pcVar8 - (long)pStr];
      *p = pcVar8 + 1;
      if (pcVar8 + 1 < pcVar3) {
        lVar9 = 0;
        do {
          Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,(word *)((long)local_1838 + lVar9),nVars);
          pcVar8 = *p + 1;
          *p = pcVar8;
          lVar9 = lVar9 + 0x200;
        } while (pcVar8 < pcVar3);
        if (lVar9 == 0x600) {
          if (0 < (int)nWordsR) {
            uVar7 = 0;
            do {
              pRes[uVar7] = (auStack_1638[uVar7] ^ auStack_1438[uVar7]) & local_1838[uVar7] ^
                            auStack_1438[uVar7];
              uVar7 = uVar7 + 1;
            } while (nWordsR != uVar7);
          }
          if (pcVar8 == pcVar3) {
            if (cVar1 != '!' || (int)nWordsR < 1) {
              return;
            }
            uVar7 = 0;
            do {
              pRes[uVar7] = ~pRes[uVar7];
              uVar7 = uVar7 + 1;
            } while (nWordsR != uVar7);
            return;
          }
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x24b,
                        "void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
        }
      }
      __assert_fail("i == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x249,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (cVar2 == '(') {
      if (pStr[pMatches[(long)pcVar8 - (long)pStr]] != ')') {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x227,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      pcVar3 = pStr + pMatches[(long)pcVar8 - (long)pStr];
      if (0 < (int)nWordsR) {
        memset(pRes,0xff,uVar7 << 3);
      }
      pcVar8 = pcVar8 + 1;
      *p = pcVar8;
      if (pcVar8 < pcVar3) {
        do {
          Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,local_1838,nVars);
          if (0 < (int)nWordsR) {
            uVar7 = 0;
            do {
              pRes[uVar7] = pRes[uVar7] & local_1838[uVar7];
              uVar7 = uVar7 + 1;
            } while (nWordsR != uVar7);
          }
          pcVar8 = *p + 1;
          *p = pcVar8;
        } while (pcVar8 < pcVar3);
      }
      if (pcVar8 != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x22e,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (cVar1 == '!' && 0 < (int)nWordsR) {
        uVar7 = 0;
        do {
          pRes[uVar7] = ~pRes[uVar7];
          uVar7 = uVar7 + 1;
        } while (nWordsR != uVar7);
      }
    }
    else {
      if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x25f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      nVars_00 = Abc_TtReadHex(local_1a38,pcVar8);
      iVar5 = 1 << ((char)nVars_00 - 2U & 0x1f);
      if (nVars_00 < 3) {
        iVar5 = 1;
      }
      pcVar3 = *p;
      pcVar8 = pcVar3 + iVar5;
      *p = pcVar8;
      if ((pcVar3[iVar5] != '{') ||
         (pcVar3 = pStr + pMatches[(long)pcVar8 - (long)pStr], *pcVar3 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x256,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      pcVar8 = pcVar8 + 1;
      *p = pcVar8;
      iVar5 = 0;
      if (pcVar8 < pcVar3) {
        pwVar10 = local_1838;
        iVar5 = 0;
        do {
          Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pwVar10,nVars);
          pcVar8 = *p + 1;
          *p = pcVar8;
          pwVar10 = pwVar10 + 0x40;
          iVar5 = iVar5 + 1;
        } while (pcVar8 < pcVar3);
      }
      if (iVar5 != nVars_00) {
        __assert_fail("i == nVarsF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x259,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (pcVar8 != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x25a,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      Dau_DsdTruthCompose_rec(local_1a38,&local_1838,pRes,nVars_00,nWordsR);
      if (0 < (int)nWordsR && cVar1 == '!') {
        uVar7 = 0;
        do {
          pRes[uVar7] = ~pRes[uVar7];
          uVar7 = uVar7 + 1;
        } while (nWordsR != uVar7);
      }
    }
  }
  return;
}

Assistant:

void Dau_DsdToTruth_rec( char * pStr, char ** p, int * pMatches, word ** pTtElems, word * pRes, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < nVars );
        Abc_TtCopy( pRes, pTtElems[**p - 'a'], nWords, fCompl );
        return;
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '(' && *q == ')' );
        Abc_TtConst1( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtAnd( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '[' && *q == ']' );
        Abc_TtConst0( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtXor( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '<' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[3][DAU_MAX_WORD];
        int i;
        assert( **p == '<' && *q == '>' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp[i], nVars );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], nWords );
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], pFunc[DAU_MAX_WORD];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pFanins[i], nVars );
        assert( i == nVarsF );
        assert( *p == q );
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVarsF, nWords );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    assert( 0 );
}